

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86_avx::forward(Crop_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *__ptr;
  Allocator *pAVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int *piVar24;
  pointer pMVar25;
  int iVar26;
  Option *opt_00;
  int iVar27;
  long lVar28;
  ulong uVar29;
  sbyte sVar30;
  int q_1;
  uint uVar31;
  int *piVar32;
  int iVar33;
  int q;
  int z;
  long lVar34;
  bool bVar35;
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  int local_fc;
  int _outc;
  int _hoffset;
  int local_f0;
  int _outd;
  int local_e8;
  int local_e4;
  Option *local_e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_c0;
  Allocator *local_b8;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int iStack_a0;
  size_t local_98;
  int _coffset;
  int local_88;
  int _doffset;
  Mat m_2;
  
  local_fc = bottom_blob->w;
  local_f0 = bottom_blob->h;
  local_88 = bottom_blob->d;
  local_e8 = bottom_blob->c;
  iVar27 = bottom_blob->dims;
  uVar29 = bottom_blob->elemsize;
  local_e4 = bottom_blob->elempack;
  iVar33 = 1;
  m.dims = iVar33;
  m.c = iVar33;
  local_e0 = opt;
  if (((this->super_Crop).starts_expr._M_string_length == 0) ||
     ((this->super_Crop).ends_expr._M_string_length == 0)) {
    if (iVar27 - 1U < 4) {
      lVar28 = (long)local_fc;
      switch(iVar27) {
      case 1:
        m.elemsize._0_4_ = 4;
        m.w = local_e4 * local_fc;
        m.h = 1;
        m.d = 1;
        m.cstep = (size_t)m.w;
        m.elempack = iVar33;
        goto LAB_0025ddfc;
      case 2:
        m.h = local_e4 * local_f0;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar28;
        goto LAB_0025ddd3;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar28 = local_f0 * lVar28;
        break;
      case 4:
        m.dims = 4;
        lVar28 = local_f0 * lVar28 * (long)local_88;
        m.d = local_88;
      }
      m.c = local_e4 * local_e8;
      m.cstep = lVar28 + 3U & 0x3ffffffffffffffc;
      m.h = local_f0;
LAB_0025ddd3:
      m.elempack = 1;
      m.elemsize._0_4_ = 4;
      m.w = local_fc;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_0025ddfc:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    piVar32 = &_doffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,&_woffset,&_hoffset,piVar32,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar24 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + -1;
      UNLOCK();
      if (*piVar24 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_0025e0f6;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blob_shapes,1,(allocator_type *)&m);
  pMVar25 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  switch(bottom_blob->dims) {
  case 1:
    m.cstep = (long)bottom_blob->elempack * (long)bottom_blob->w;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    goto LAB_0025df3a;
  case 2:
    m.w = bottom_blob->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    lVar28 = (long)bottom_blob->elempack * (long)bottom_blob->h;
    m.dims = 2;
    m.h = (int)lVar28;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar28 * m.w;
    break;
  case 3:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 3;
    m.d = 1;
    lVar28 = (long)m.h * (long)m.w;
    goto LAB_0025df29;
  case 4:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.d = bottom_blob->d;
    m.dims = 4;
    lVar28 = (long)m.h * (long)m.w * (long)m.d;
LAB_0025df29:
    m.cstep = lVar28 + 3U & 0x3ffffffffffffffc;
LAB_0025df3a:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar32 = (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->refcount;
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          free((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start)->data);
        }
        else {
          (*(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar25->cstep = 0;
    pMVar25->data = (void *)0x0;
    pMVar25->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar25->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar25->elemsize + 4) = 0;
    pMVar25->dims = 0;
    pMVar25->w = 0;
    pMVar25->h = 0;
    pMVar25->d = 0;
    pMVar25->c = 0;
    piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar25->data = m.data;
    pMVar25->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar25->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
    pMVar25->elempack = m.elempack;
    pMVar25->allocator = m.allocator;
    pMVar25->dims = m.dims;
    pMVar25->w = m.w;
    pMVar25->h = m.h;
    pMVar25->d = m.d;
    pMVar25->c = m.c;
    pMVar25->cstep = m.cstep;
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar32 = &_doffset;
  Crop::eval_crop_expr
            (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,piVar32,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
LAB_0025e0f6:
  opt_00 = local_e0;
  if (local_e4 == 4) {
    if (iVar27 - 1U < 4) {
      iVar33 = _outc >> 2;
      switch(iVar27) {
      case 1:
        uVar31 = _outw & 3;
        iVar27 = (uint)(uVar31 == 0) * 3 + 1;
        uVar2 = (long)_outw % (long)iVar27;
        if (local_fc == _outw / iVar27 && uVar31 == 0) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar32 = bottom_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
          }
          piVar32 = top_blob->refcount;
          if (piVar32 == (int *)0x0) goto LAB_0025ed90;
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 != 0) goto LAB_0025ed90;
          __ptr = top_blob->data;
          pAVar1 = top_blob->allocator;
          goto joined_r0x0025e23e;
        }
        if (((_outw | _woffset) & 3U) == 0) {
          Mat::create(top_blob,_outw / iVar27,(uVar29 >> 2) << (uVar31 == 0) * '\x02',iVar27,
                      local_e0->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            crop_pack4_sse(bottom_blob,top_blob,0,_woffset / 4);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        if (_outw == local_fc) {
          iVar27 = (uint)((_outh & 3U) == 0) * 3 + 1;
          uVar2 = (long)_outh % (long)iVar27;
          if (((_outh & 3U) == 0) && (_outh / iVar27 == local_f0)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar32 = bottom_blob->refcount;
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + 1;
              UNLOCK();
            }
            piVar32 = top_blob->refcount;
            if (piVar32 == (int *)0x0) goto LAB_0025ed90;
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 != 0) goto LAB_0025ed90;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x0025e23e;
          }
        }
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh >> 2,(uVar29 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                      local_e0->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            crop_pack4_sse(bottom_blob,top_blob,_hoffset / 4,_woffset);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar31 = _outc & 3;
        bVar35 = local_f0 == _outh;
        bVar3 = local_fc == _outw;
        if (bVar35 && bVar3) {
          iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
          uVar2 = (long)_outc % (long)iVar27;
          if (((_outc & 3U) == 0) && (_outc / iVar27 == local_e8)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar32 = bottom_blob->refcount;
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + 1;
              UNLOCK();
            }
            piVar32 = top_blob->refcount;
            if (piVar32 == (int *)0x0) goto LAB_0025ed90;
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 != 0) goto LAB_0025ed90;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x0025e23e;
          }
        }
        if (((_coffset | _outc) & 3U) == 0) {
          uVar2 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar2 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar2;
          m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
          uVar8 = bottom_blob->dims;
          uVar9 = bottom_blob->w;
          uVar10 = bottom_blob->h;
          uVar11 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar2;
          m.dims = uVar8;
          m.w = uVar9;
          m.h = uVar10;
          m.d = uVar11;
          m.c = iVar33;
          if (bVar35 && bVar3) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_e0->blob_allocator,_outh,
                       (void *)CONCAT71((int7)((ulong)piVar32 >> 8),bVar35 && bVar3));
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar32 = top_blob->refcount;
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_c0;
              top_blob->allocator = local_b8;
              top_blob->dims = iStack_b0;
              top_blob->w = iStack_ac;
              top_blob->h = iStack_a8;
              top_blob->d = iStack_a4;
              top_blob->c = iStack_a0;
              top_blob->cstep = local_98;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_b8 == (Allocator *)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*local_b8->_vptr_Allocator[3])();
                }
              }
            }
            iVar27 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0025eebd;
          }
          else {
LAB_0025eebd:
            Mat::create(top_blob,_outw,_outh,_outc / 4,(uVar29 >> 2) << (uVar31 == 0) * '\x02',4,
                        opt_00->blob_allocator);
            iVar27 = -100;
            if ((top_blob->data != (void *)0x0) &&
               (uVar29 = (ulong)top_blob->c, top_blob->cstep * uVar29 != 0)) {
              iVar27 = 0;
              for (lVar28 = 0; lVar28 < (int)uVar29; lVar28 = lVar28 + 1) {
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(m.cstep * lVar28 *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage +
                              (long)m.data);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                m_2.w = top_blob->w;
                m_2.h = top_blob->h;
                m_2.elemsize = top_blob->elemsize;
                m_2.data = (void *)(top_blob->cstep * lVar28 * m_2.elemsize + (long)top_blob->data);
                m_2.elempack = top_blob->elempack;
                m_2.allocator = top_blob->allocator;
                m_2.refcount = (int *)0x0;
                m_2.c = top_blob->d;
                m_2.d = 1;
                m_2.dims = top_blob->dims + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (top_blob->dims == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                uVar29 = (ulong)(uint)top_blob->c;
              }
            }
          }
          piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar32 == (int *)0x0) {
            return iVar27;
          }
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 != 0) {
            return iVar27;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar27;
          }
          goto LAB_0025ecee;
        }
        break;
      case 4:
        uVar31 = _outc & 3;
        if (local_88 == _outd && (local_f0 == _outh && local_fc == _outw)) {
          iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
          uVar2 = (long)_outc % (long)iVar27;
          if (((_outc & 3U) == 0) && (_outc / iVar27 == local_e8)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar32 = bottom_blob->refcount;
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + 1;
              UNLOCK();
            }
            piVar32 = top_blob->refcount;
            if (piVar32 == (int *)0x0) goto LAB_0025ed90;
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 != 0) goto LAB_0025ed90;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x0025e23e;
          }
        }
        if (((_coffset | _outc) & 3U) == 0) {
          uVar2 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar2 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar2;
          m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
          uVar16 = bottom_blob->dims;
          uVar17 = bottom_blob->w;
          uVar18 = bottom_blob->h;
          uVar19 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar2;
          m.dims = uVar16;
          m.w = uVar17;
          m.h = uVar18;
          m.d = uVar19;
          m.c = iVar33;
          if (local_88 != _outd || (local_f0 != _outh || local_fc != _outw)) {
LAB_0025f194:
            Mat::create(top_blob,_outw,_outh,_outd,_outc / 4,(uVar29 >> 2) << (uVar31 == 0) * '\x02'
                        ,4,opt_00->blob_allocator);
            iVar27 = -100;
            if ((top_blob->data != (void *)0x0) &&
               (uVar29 = (ulong)top_blob->c, top_blob->cstep * uVar29 != 0)) {
              for (lVar28 = 0; lVar28 < (int)uVar29; lVar28 = lVar28 + 1) {
                for (lVar34 = 0; lVar34 < _outd; lVar34 = lVar34 + 1) {
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)m.data +
                                (long)(_doffset + (int)lVar34) *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                                (long)m.h * (long)m.w +
                                m.cstep * lVar28 *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  m_2.dims = 2;
                  m_2.w = top_blob->w;
                  m_2.h = top_blob->h;
                  m_2.elemsize = top_blob->elemsize;
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                  m_2.data = (void *)((long)top_blob->data +
                                     lVar34 * m_2.elemsize * m_2.cstep +
                                     top_blob->cstep * lVar28 * m_2.elemsize);
                  m_2.refcount = (int *)0x0;
                  m_2.d = 1;
                  m_2.c = 1;
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                }
                uVar29 = (ulong)(uint)top_blob->c;
              }
              iVar27 = 0;
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_e0->blob_allocator,_outd,
                       (void *)(ulong)(uint)_outh);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar32 = top_blob->refcount;
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_c0;
              top_blob->allocator = local_b8;
              top_blob->dims = iStack_b0;
              top_blob->w = iStack_ac;
              top_blob->h = iStack_a8;
              top_blob->d = iStack_a4;
              top_blob->c = iStack_a0;
              top_blob->cstep = local_98;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_b8 == (Allocator *)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*local_b8->_vptr_Allocator[3])();
                }
              }
            }
            iVar27 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0025f194;
          }
          piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar32 == (int *)0x0) {
            return iVar27;
          }
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 != 0) {
            return iVar27;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar27;
          }
          goto LAB_0025ecee;
        }
      }
    }
    goto switchD_0025e131_default;
  }
  if (local_e4 != 8) goto switchD_0025e131_default;
  iVar33 = 8;
  switch(iVar27) {
  case 1:
    uVar31 = _outw & 7;
    bVar35 = (_outw & 3U) == 0;
    iVar27 = (uint)bVar35 * 3 + 1;
    if (uVar31 == 0) {
      iVar27 = iVar33;
    }
    sVar30 = bVar35 * '\x02';
    if (uVar31 == 0) {
      sVar30 = 3;
    }
    uVar2 = (long)_outw % (long)iVar27;
    if (local_fc == _outw / iVar27 && uVar31 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar32 = bottom_blob->refcount;
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + 1;
        UNLOCK();
      }
      piVar32 = top_blob->refcount;
      if (piVar32 == (int *)0x0) goto LAB_0025ed90;
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 != 0) goto LAB_0025ed90;
      __ptr = top_blob->data;
      pAVar1 = top_blob->allocator;
joined_r0x0025e23e:
      if (pAVar1 == (Allocator *)0x0) {
        free(__ptr);
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,__ptr,uVar2 & 0xffffffff);
      }
LAB_0025ed90:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar32 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar32;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar27 = bottom_blob->w;
      iVar33 = bottom_blob->h;
      iVar26 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar27;
      top_blob->h = iVar33;
      top_blob->d = iVar26;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 7U) == 0) {
      Mat::create(top_blob,_outw / iVar27,(uVar29 >> 3) << sVar30,8,local_e0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        crop_pack8_avx(bottom_blob,top_blob,0,_woffset / 8);
        return 0;
      }
      return -100;
    }
    break;
  case 2:
    sVar30 = ((_outh & 3U) == 0) * '\x02';
    if ((_outh & 7U) == 0) {
      sVar30 = 3;
    }
    if (_outw == local_fc) {
      iVar27 = (uint)((_outh & 3U) == 0) * 3 + 1;
      if ((_outh & 7U) == 0) {
        iVar27 = 8;
      }
      uVar2 = (long)_outh % (long)iVar27;
      if (((_outh & 7U) == 0) && (_outh / iVar27 == local_f0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar32 = bottom_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 == (int *)0x0) goto LAB_0025ed90;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_0025ed90;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x0025e23e;
      }
    }
    if (((_hoffset | _outh) & 7U) == 0) {
      Mat::create(top_blob,_outw,_outh / 8,(uVar29 >> 3) << sVar30,8,local_e0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        crop_pack8_avx(bottom_blob,top_blob,_hoffset / 8,_woffset);
        return 0;
      }
      return -100;
    }
    break;
  case 3:
    sVar30 = ((_outc & 3U) == 0) * '\x02';
    if ((_outc & 7U) == 0) {
      sVar30 = 3;
    }
    if (local_f0 == _outh && local_fc == _outw) {
      iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
      if ((_outc & 7U) == 0) {
        iVar27 = iVar33;
      }
      uVar2 = (long)_outc % (long)iVar27;
      if (((_outc & 7U) == 0) && (_outc / iVar27 == local_e8)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar32 = bottom_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 == (int *)0x0) goto LAB_0025ed90;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_0025ed90;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x0025e23e;
      }
    }
    if (((_coffset | _outc) & 7U) != 0) break;
    iVar27 = (int)((long)_outc / 8);
    uVar2 = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset / 8) * bottom_blob->cstep * uVar2 + (long)bottom_blob->data);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar2;
    m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
    uVar4 = bottom_blob->dims;
    uVar5 = bottom_blob->w;
    uVar6 = bottom_blob->h;
    uVar7 = bottom_blob->d;
    m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
              0xfffffffffffffff0) / uVar2;
    m.dims = uVar4;
    m.w = uVar5;
    m.h = uVar6;
    m.d = uVar7;
    m.c = iVar27;
    if (local_f0 != _outh || local_fc != _outw) {
LAB_0025f454:
      Mat::create(top_blob,_outw,_outh,iVar27,(uVar29 >> 3) << sVar30,8,opt_00->blob_allocator);
      iVar27 = -100;
      if ((top_blob->data != (void *)0x0) &&
         (uVar29 = (ulong)top_blob->c, top_blob->cstep * uVar29 != 0)) {
        iVar27 = 0;
        for (lVar28 = 0; lVar28 < (int)uVar29; lVar28 = lVar28 + 1) {
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(m.cstep * lVar28 *
                         (long)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)m.data);
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          m_2.w = top_blob->w;
          m_2.h = top_blob->h;
          m_2.elemsize = top_blob->elemsize;
          m_2.data = (void *)(top_blob->cstep * lVar28 * m_2.elemsize + (long)top_blob->data);
          m_2.elempack = top_blob->elempack;
          m_2.allocator = top_blob->allocator;
          m_2.refcount = (int *)0x0;
          m_2.c = top_blob->d;
          m_2.d = 1;
          m_2.dims = top_blob->dims + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (top_blob->dims == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
          uVar29 = (ulong)(uint)top_blob->c;
        }
      }
    }
    else {
      Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_e0->blob_allocator,_outh,
                 (void *)((long)_outc / 8 & 0xffffffff));
      if ((Mat *)&bottom_blob_shapes != top_blob) {
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data =
             bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
        top_blob->refcount =
             (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        top_blob->elemsize =
             (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        top_blob->elempack = iStack_c0;
        top_blob->allocator = local_b8;
        top_blob->dims = iStack_b0;
        top_blob->w = iStack_ac;
        top_blob->h = iStack_a8;
        top_blob->d = iStack_a4;
        top_blob->c = iStack_a0;
        top_blob->cstep = local_98;
      }
      if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->data =
             *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->data + -1;
        UNLOCK();
        if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
          if (local_b8 == (Allocator *)0x0) {
            free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start);
          }
          else {
            (*local_b8->_vptr_Allocator[3])();
          }
        }
      }
      iVar27 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar27 = _outc / 8;
        goto LAB_0025f454;
      }
    }
    piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar32 == (int *)0x0) {
      return iVar27;
    }
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 != 0) {
      return iVar27;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar27;
    }
    goto LAB_0025ecee;
  case 4:
    sVar30 = ((_outc & 3U) == 0) * '\x02';
    if ((_outc & 7U) == 0) {
      sVar30 = 3;
    }
    if (local_88 == _outd && (local_f0 == _outh && local_fc == _outw)) {
      iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
      if ((_outc & 7U) == 0) {
        iVar27 = iVar33;
      }
      uVar2 = (long)_outc % (long)iVar27;
      if (((_outc & 7U) == 0) && (_outc / iVar27 == local_e8)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar32 = bottom_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 == (int *)0x0) goto LAB_0025ed90;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_0025ed90;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x0025e23e;
      }
    }
    if (((_coffset | _outc) & 7U) == 0) {
      iVar33 = _outc / 8;
      uVar2 = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset / 8) * bottom_blob->cstep * uVar2 + (long)bottom_blob->data)
      ;
      iVar27 = -100;
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar2;
      m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
      uVar12 = bottom_blob->dims;
      uVar13 = bottom_blob->w;
      uVar14 = bottom_blob->h;
      uVar15 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar2;
      m.dims = uVar12;
      m.w = uVar13;
      m.h = uVar14;
      m.d = uVar15;
      m.c = iVar33;
      if (local_88 != _outd || (local_f0 != _outh || local_fc != _outw)) {
LAB_0025f72a:
        Mat::create(top_blob,_outw,_outh,_outd,iVar33,(uVar29 >> 3) << sVar30,8,
                    opt_00->blob_allocator);
        if ((top_blob->data != (void *)0x0) &&
           (uVar29 = (ulong)top_blob->c, top_blob->cstep * uVar29 != 0)) {
          for (lVar28 = 0; lVar28 < (int)uVar29; lVar28 = lVar28 + 1) {
            for (lVar34 = 0; lVar34 < _outd; lVar34 = lVar34 + 1) {
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)m.data +
                            (long)(_doffset + (int)lVar34) *
                            (long)bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage * (long)m.h * (long)m.w
                            + m.cstep * lVar28 *
                              (long)bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              m_2.dims = 2;
              m_2.w = top_blob->w;
              m_2.h = top_blob->h;
              m_2.elemsize = top_blob->elemsize;
              m_2.elempack = top_blob->elempack;
              m_2.allocator = top_blob->allocator;
              m_2.cstep = (long)m_2.h * (long)m_2.w;
              m_2.data = (void *)((long)top_blob->data +
                                 lVar34 * m_2.elemsize * m_2.cstep +
                                 top_blob->cstep * lVar28 * m_2.elemsize);
              m_2.refcount = (int *)0x0;
              m_2.d = 1;
              m_2.c = 1;
              crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
            }
            uVar29 = (ulong)(uint)top_blob->c;
          }
          iVar27 = 0;
        }
      }
      else {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_e0->blob_allocator,_outd,
                   (void *)(ulong)(uint)_outh);
        if ((Mat *)&bottom_blob_shapes != top_blob) {
          if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish)->data + 1;
            UNLOCK();
          }
          piVar32 = top_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          top_blob->refcount =
               (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          top_blob->elemsize =
               (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          top_blob->elempack = iStack_c0;
          top_blob->allocator = local_b8;
          top_blob->dims = iStack_b0;
          top_blob->w = iStack_ac;
          top_blob->h = iStack_a8;
          top_blob->d = iStack_a4;
          top_blob->c = iStack_a0;
          top_blob->cstep = local_98;
        }
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_b8 == (Allocator *)0x0) {
              free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
            else {
              (*local_b8->_vptr_Allocator[3])();
            }
          }
        }
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar33 = _outc / 8;
          goto LAB_0025f72a;
        }
      }
      piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar32 == (int *)0x0) {
        return iVar27;
      }
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 != 0) {
        return iVar27;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar27;
      }
      goto LAB_0025ecee;
    }
  }
switchD_0025e131_default:
  piVar32 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar20 = bottom_blob->dims;
  uVar21 = bottom_blob->w;
  uVar22 = bottom_blob->h;
  uVar23 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + 1;
    UNLOCK();
  }
  m.dims = uVar20;
  m.w = uVar21;
  m.h = uVar22;
  m.d = uVar23;
  if (local_e4 == 1) {
LAB_0025eca3:
    iVar27 = Crop::forward(&this->super_Crop,&m,top_blob,opt_00);
  }
  else {
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)local_e0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_e0->workspace_allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_e0->workspace_allocator;
    convert_packing(bottom_blob,&m,1,(Option *)&bottom_blob_shapes);
    if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) goto LAB_0025eca3;
    iVar27 = -100;
  }
  piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (m.allocator == (Allocator *)0x0) {
LAB_0025ecee:
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int Crop_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}